

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O0

jsgf_rule_t * jsgf_get_public_rule(jsgf_t *grammar)

{
  int iVar1;
  jsgf_rule_t *rule_00;
  char *pcVar2;
  char *pcVar3;
  char *__s2;
  char *dot_pos;
  char *rule_name;
  jsgf_rule_t *rule;
  jsgf_rule_t *public_rule;
  jsgf_rule_iter_t *itor;
  jsgf_t *grammar_local;
  
  public_rule = (jsgf_rule_t *)jsgf_rule_iter(grammar);
  do {
    if (public_rule == (jsgf_rule_t *)0x0) {
      return (jsgf_rule_t *)0x0;
    }
    rule_00 = jsgf_rule_iter_rule((jsgf_rule_iter_t *)public_rule);
    iVar1 = jsgf_rule_public(rule_00);
    if (iVar1 != 0) {
      pcVar2 = jsgf_rule_name(rule_00);
      pcVar3 = strrchr(pcVar2 + 1,0x2e);
      if (pcVar3 == (char *)0x0) {
        jsgf_rule_iter_free((jsgf_rule_iter_t *)public_rule);
        return rule_00;
      }
      __s2 = jsgf_grammar_name(grammar);
      iVar1 = strncmp(pcVar2 + 1,__s2,(size_t)(pcVar3 + (-1 - (long)pcVar2)));
      if (iVar1 == 0) {
        jsgf_rule_iter_free((jsgf_rule_iter_t *)public_rule);
        return rule_00;
      }
    }
    public_rule = (jsgf_rule_t *)jsgf_rule_iter_next((jsgf_rule_iter_t *)public_rule);
  } while( true );
}

Assistant:

jsgf_rule_t *
jsgf_get_public_rule(jsgf_t * grammar)
{
    jsgf_rule_iter_t *itor;
    jsgf_rule_t *public_rule = NULL;

    for (itor = jsgf_rule_iter(grammar); itor;
         itor = jsgf_rule_iter_next(itor)) {
        jsgf_rule_t *rule = jsgf_rule_iter_rule(itor);
        if (jsgf_rule_public(rule)) {
            const char *rule_name = jsgf_rule_name(rule);
            char *dot_pos;
            if ((dot_pos = strrchr(rule_name + 1, '.')) == NULL) {
                public_rule = rule;
                jsgf_rule_iter_free(itor);
                break;
            }
            if (0 ==
                strncmp(rule_name + 1, jsgf_grammar_name(grammar),
                        dot_pos - rule_name - 1)) {
                public_rule = rule;
                jsgf_rule_iter_free(itor);
                break;
            }
        }
    }
    return public_rule;
}